

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::Write(DBImpl *this,WriteOptions *options,WriteBatch *updates)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  _func_int **pp_Var2;
  Writer *this_00;
  int iVar3;
  MemTable *memtable;
  long in_RCX;
  uint64_t s;
  Writer *pWVar4;
  bool bVar5;
  Writer *last_writer;
  Writer w;
  Writer *local_b0;
  long local_a8;
  long local_a0;
  undefined1 local_98 [24];
  Writer local_80;
  
  __mutex = (pthread_mutex_t *)(options + 200);
  Writer::Writer(&local_80,(Mutex *)&__mutex->__data);
  local_80.sync = *(bool *)&(updates->rep_)._M_dataplus._M_p;
  local_80.done = false;
  std::mutex::lock((mutex *)&__mutex->__data);
  local_98._0_8_ = &local_80;
  std::deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>>::
  emplace_back<leveldb::DBImpl::Writer*>
            ((deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>> *)
             (options + 0x168),(Writer **)local_98);
  while( true ) {
    if (local_80.done != false) goto LAB_00112e5a;
    if (&local_80 == (Writer *)**(undefined8 **)(options + 0x178)) break;
    port::CondVar::Wait(&local_80.cv);
  }
  MakeRoomForWrite(this,SUB81(options,0));
  lVar1 = *(long *)(*(long *)(options + 0x228) + 0x58);
  pWVar4 = &local_80;
  local_b0 = &local_80;
  if ((in_RCX != 0) && ((this->super_DB)._vptr_DB == (_func_int **)0x0)) {
    memtable = (MemTable *)BuildBatchGroup((DBImpl *)options,&local_b0);
    local_a0 = lVar1;
    WriteBatchInternal::SetSequence((WriteBatch *)memtable,lVar1 + 1);
    iVar3 = WriteBatchInternal::Count((WriteBatch *)memtable);
    local_a8 = (long)iVar3;
    pthread_mutex_unlock(__mutex);
    local_98._0_8_ = (memtable->comparator_).comparator.super_Comparator._vptr_Comparator;
    local_98._8_8_ = (memtable->comparator_).comparator.user_comparator_;
    log::Writer::AddRecord((Writer *)(local_98 + 0x10),*(Slice **)(options + 0x158));
    pp_Var2 = (this->super_DB)._vptr_DB;
    (this->super_DB)._vptr_DB = (_func_int **)local_98._16_8_;
    local_98._16_8_ = pp_Var2;
    Status::~Status((Status *)(local_98 + 0x10));
    if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
      if (*(char *)&(updates->rep_)._M_dataplus._M_p == '\x01') {
        (**(code **)(**(long **)(options + 0x148) + 0x28))((Status *)local_98);
        pWVar4 = (Writer *)(this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_98._0_8_;
        local_98._0_8_ = pWVar4;
        Status::~Status((Status *)local_98);
        bVar5 = (this->super_DB)._vptr_DB != (_func_int **)0x0;
        if (!bVar5) goto LAB_00112f82;
      }
      else {
        bVar5 = false;
LAB_00112f82:
        WriteBatchInternal::InsertInto((WriteBatch *)local_98,memtable);
        pWVar4 = (Writer *)(this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_98._0_8_;
        local_98._0_8_ = pWVar4;
        Status::~Status((Status *)local_98);
      }
      std::mutex::lock((mutex *)&__mutex->__data);
      if (bVar5) {
        RecordBackgroundError((DBImpl *)options,(Status *)this);
      }
    }
    else {
      std::mutex::lock((mutex *)&__mutex->__data);
    }
    s = local_a0 + local_a8;
    if (memtable == *(MemTable **)(options + 0x1b8)) {
      WriteBatch::Clear((WriteBatch *)*(MemTable **)(options + 0x1b8));
    }
    VersionSet::SetLastSequence(*(VersionSet **)(options + 0x228),s);
    pWVar4 = local_b0;
  }
  do {
    this_00 = (Writer *)**(undefined8 **)(options + 0x178);
    std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::pop_front
              ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
               (options + 0x168));
    if (this_00 != &local_80) {
      Status::operator=((Status *)this_00,(Status *)this);
      this_00->done = true;
      std::condition_variable::notify_one();
    }
  } while (this_00 != pWVar4);
  if (*(long *)(options + 0x198) != *(long *)(options + 0x178)) {
    std::condition_variable::notify_one();
  }
LAB_00113052:
  pthread_mutex_unlock(__mutex);
  Writer::~Writer(&local_80);
  return (Status)(char *)this;
LAB_00112e5a:
  Status::Status((Status *)this,&local_80.status);
  goto LAB_00113052;
}

Assistant:

Status DBImpl::Write(const WriteOptions& options, WriteBatch* updates) {
  Writer w(&mutex_);
  w.batch = updates;
  w.sync = options.sync;
  w.done = false;

  //LevelDB加锁保证同一时刻只能有一个Writer工作。其他Writer挂起等待，直到前一个Writer执行完毕后唤醒。
  MutexLock l(&mutex_);
  writers_.push_back(&w);
  while (!w.done && &w != writers_.front()) {
    w.cv.Wait();
  }
  if (w.done) {
    return w.status;
  }

  // May temporarily unlock and wait.
  Status status = MakeRoomForWrite(updates == nullptr);//做一些写入前的check，包括如是不是该停写，是不是该切memtable，是不是该compact等
  uint64_t last_sequence = versions_->LastSequence();//获取最大的序列号
  Writer* last_writer = &w;// laster_writer的意思是打包多个write中的最后一个writer
  if (status.ok() && updates != nullptr) {  // nullptr batch is for compactions
    WriteBatch* write_batch = BuildBatchGroup(&last_writer);//这个函数要拿出来，重点说一下
    // 这里要联系到上边的 MutexLock l(&mutex_); 下边的那段代码：
    // 合并writers里多个writer的WriteBatch，就是上面write deque里阻塞住的writer完成他们的任务
    // 第一个进来的写操作会在真正写log文件和写memtable时候把锁放掉，
    // 这时候别的写操作会进来把自己push到writes_的deque中，然后挂起在自己的条件锁上（ w.cv.Wait();）
    // 为什么呢？因为此时自己的done不是true并且自己不是deque中的第一个writer，
    // 等第一个writer全部操作完之后呢，会把此时deque中的所有writer唤醒,为什么醒了之后第一步是判断自己是不是done呢，自己还没执行怎么可能会done呢
    // 其实这就是leveldb的优化，当前抢到锁进来的writer会在真正操作之前把此时deque中所有的writer的任务都拿过来（实际上不是全拿过来，有数量限制），
    // 然后帮他们都做了，并且把结果放回至每个writer对应的status中，最后再唤醒所有writer，所以这些writer醒来后发现自己的任务已经被做了，就直接拿自己的返回值返回了

    WriteBatchInternal::SetSequence(write_batch, last_sequence + 1);//本次写入对应的序列号
    last_sequence += WriteBatchInternal::Count(write_batch);//更新last_sequence，加的个数等于此次是WriteBatch中操作的个数

    // Add to log and apply to memtable.  We can release the lock
    // during this phase since &w is currently responsible for logging
    // and protects against concurrent loggers and concurrent writes
    // into mem_.
    {
      mutex_.Unlock();//写log和写memtable时可以放锁，让别的write进入deque，以减少互斥时间
      status = log_->AddRecord(WriteBatchInternal::Contents(write_batch));
      bool sync_error = false;
      if (status.ok() && options.sync) {
        status = logfile_->Sync();
        if (!status.ok()) {
          sync_error = true;
        }
      }
      if (status.ok()) {
        status = WriteBatchInternal::InsertInto(write_batch, mem_);
      }
      mutex_.Lock();//再次加锁，互斥的更新versions的last_sequence
      if (sync_error) {
        // The state of the log file is indeterminate: the log record we
        // just added may or may not show up when the DB is re-opened.
        // So we force the DB into a mode where all future writes fail.
        RecordBackgroundError(status);
      }
    }
    if (write_batch == tmp_batch_) tmp_batch_->Clear();

    versions_->SetLastSequence(last_sequence);
  }

  //从deque的第一个writer开始pop，第一个writer一定是当前操作的writer，
  //直到pop到本次打包的最后一个writer
  while (true) {
    Writer* ready = writers_.front();
    writers_.pop_front();
    if (ready != &w) {
      ready->status = status;
      ready->done = true;
      ready->cv.Signal();
    }
    if (ready == last_writer) break;
  }

  // Notify new head of write queue
  //唤醒此时的deque头writer，从它开始进行接下来的写入
  if (!writers_.empty()) {
    writers_.front()->cv.Signal();
  }

  return status;
}